

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> * __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::operator=
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *vec)

{
  size_t sVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar2;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *in_RSI;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *in_RDI;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *in_stack_ffffffffffffffe0;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *__src;
  
  clear(in_stack_ffffffffffffffe0);
  sVar1 = size(in_RSI);
  in_RDI->size_ = sVar1;
  sVar1 = capacity(in_RSI);
  in_RDI->capacity_ = sVar1;
  if (in_RSI == (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)in_RSI->ptr_)
  {
    memcpy(in_RDI,in_RSI,in_RDI->size_ << 4);
    in_RDI->ptr_ = in_RDI->buffer_;
  }
  else {
    sVar1 = capacity(in_RSI);
    ppVar2 = (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)malloc(sVar1 << 4);
    in_RDI->ptr_ = ppVar2;
    if (in_RDI->ptr_ == (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::operator=(const LocalVector<T> &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    ppVar2 = in_RDI->ptr_;
    __src = in_RSI->ptr_;
    sVar1 = size(in_RSI);
    memcpy(ppVar2,__src,sVar1 << 4);
  }
  return in_RDI;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }